

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeMemGetAddressRange(ze_context_handle_t hContext,void *ptr,void **pBase,size_t *pSize)

{
  ze_pfnMemGetAddressRange_t pfnGetAddressRange;
  dditable_t *dditable;
  ze_result_t result;
  size_t *pSize_local;
  void **pBase_local;
  void *ptr_local;
  ze_context_handle_t hContext_local;
  
  if (*(code **)(*(long *)(hContext + 8) + 0x3d8) == (code *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hContext_local._4_4_ =
         (**(code **)(*(long *)(hContext + 8) + 0x3d8))(*(undefined8 *)hContext,ptr,pBase,pSize);
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetAddressRange(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] memory pointer to query
        void** pBase,                                   ///< [in,out][optional] base address of the allocation
        size_t* pSize                                   ///< [in,out][optional] size of the allocation
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_context_object_t*>( hContext )->dditable;
        auto pfnGetAddressRange = dditable->ze.Mem.pfnGetAddressRange;
        if( nullptr == pfnGetAddressRange )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<ze_context_object_t*>( hContext )->handle;

        // forward to device-driver
        result = pfnGetAddressRange( hContext, ptr, pBase, pSize );

        return result;
    }